

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * __thiscall
VulkanHppGenerator::generateTypenameCheck
          (string *__return_storage_ptr__,VulkanHppGenerator *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *returnParams,
          map<unsigned_long,_VulkanHppGenerator::VectorParamData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VulkanHppGenerator::VectorParamData>_>_>
          *vectorParams,vector<unsigned_long,_std::allocator<unsigned_long>_> *chainedReturnParams,
          bool definition,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dataTypes,CommandFlavourFlags flavourFlags)

{
  _Rb_tree_header *p_Var1;
  unsigned_long *puVar2;
  unsigned_long uVar3;
  pointer pbVar4;
  pointer pcVar5;
  size_type __n;
  undefined4 uVar6;
  int iVar7;
  pointer puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _Base_ptr p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _Base_ptr p_Var14;
  unsigned_long *puVar15;
  char *__s;
  undefined3 in_register_00000089;
  ulong uVar16;
  bool bVar17;
  string strippedValue;
  string elementType;
  string extendedElementType;
  string enableIf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined4 local_8c;
  string *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_80 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_80;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  if ((flavourFlags.m_mask & 4) == 0) {
    puVar8 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    local_8c = CONCAT31(in_register_00000089,definition);
    local_88 = __return_storage_ptr__;
    local_58 = chainedReturnParams;
    if ((returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar8) {
      p_Var1 = &(vectorParams->_M_t)._M_impl.super__Rb_tree_header;
      paVar13 = &local_110.field_2;
      uVar16 = 0;
      do {
        p_Var14 = (vectorParams->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var10 = &p_Var1->_M_header;
        if (p_Var14 != (_Base_ptr)0x0) {
          do {
            if (*(ulong *)(p_Var14 + 1) >= puVar8[uVar16]) {
              p_Var10 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[*(ulong *)(p_Var14 + 1) < puVar8[uVar16]];
          } while (p_Var14 != (_Base_ptr)0x0);
        }
        p_Var14 = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
           (p_Var14 = p_Var10, puVar8[uVar16] < *(ulong *)(p_Var10 + 1))) {
          p_Var14 = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)p_Var14 != p_Var1) {
          if ((flavourFlags.m_mask & 2) == 0) {
LAB_00156202:
            pbVar4 = (dataTypes->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            pcVar5 = pbVar4[uVar16]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_f0,pcVar5,pcVar5 + pbVar4[uVar16]._M_string_length);
          }
          else {
            puVar15 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar2 = (local_58->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            bVar17 = puVar15 == puVar2;
            if (bVar17) {
LAB_001561d9:
              if (bVar17) goto LAB_00156202;
            }
            else {
              uVar3 = *puVar15;
              while (puVar8[uVar16] != uVar3) {
                puVar15 = puVar15 + 1;
                bVar17 = puVar15 == puVar2;
                if (bVar17) goto LAB_001561d9;
                uVar3 = *puVar15;
              }
            }
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"StructureChain","")
            ;
          }
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,local_f0._M_dataplus._M_p,
                     local_f0._M_dataplus._M_p + local_f0._M_string_length);
          if ((flavourFlags.m_mask & 8) != 0) {
            std::operator+(&local_110,"UniqueHandle<",&local_f0);
            pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_110,", Dispatch>");
            local_130._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
            paVar11 = &pbVar9->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p == paVar11) {
              local_130.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_130.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
              local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            }
            else {
              local_130.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            }
            local_130._M_string_length = pbVar9->_M_string_length;
            (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar9->_M_string_length = 0;
            (pbVar9->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_b0,&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != paVar13) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
          }
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"VULKAN_HPP_NAMESPACE::","");
          local_110._M_dataplus._M_p = (pointer)paVar13;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_110,local_f0._M_dataplus._M_p,
                     local_f0._M_dataplus._M_p + local_f0._M_string_length);
          __n = local_d0._M_string_length;
          if ((local_d0._M_string_length <= local_110._M_string_length) &&
             ((local_d0._M_string_length == 0 ||
              (iVar7 = bcmp(local_110._M_dataplus._M_p,local_d0._M_dataplus._M_p,
                            local_d0._M_string_length), iVar7 == 0)))) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      (&local_110,0,__n);
          }
          anon_unknown.dwarf_1900a8::startUpperCase(&local_130,&local_110);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&local_f0,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar13) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if (local_78._M_string_length != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_78," && ");
          }
          std::operator+(&local_50,"std::is_same<typename ",&local_f0);
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_50,"Allocator::value_type, ");
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar9->_M_dataplus)._M_p;
          paVar12 = &pbVar9->field_2;
          if (paVar11 == paVar12) {
            local_d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          }
          else {
            local_d0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_d0._M_dataplus._M_p = (pointer)paVar11;
          }
          local_d0._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   _M_append(&local_d0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
          local_110._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
          paVar11 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p == paVar11) {
            local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
            local_110.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_110._M_dataplus._M_p = (pointer)paVar13;
          }
          else {
            local_110.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          }
          local_110._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar11;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_110," > ::value ");
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar9->_M_dataplus)._M_p;
          paVar12 = &pbVar9->field_2;
          if (paVar11 == paVar12) {
            local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_130.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
          }
          else {
            local_130.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
            local_130._M_dataplus._M_p = (pointer)paVar11;
          }
          local_130._M_string_length = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar12;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_78,local_130._M_dataplus._M_p,local_130._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != paVar13) {
            operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        uVar16 = uVar16 + 1;
        puVar8 = (returnParams->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar16 < (ulong)((long)(returnParams->
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >>
                               3));
    }
    __return_storage_ptr__ = local_88;
    uVar6 = local_8c;
    if (local_78._M_string_length != 0) {
      std::operator+(&local_130,", typename std::enable_if<",&local_78);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_130,", int>::type");
      local_b0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar13 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar13) {
        local_b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_b0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      __s = " = 0";
      if ((char)uVar6 != '\0') {
        __s = "";
      }
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b0,__s);
      local_f0._M_dataplus._M_p = (pbVar9->_M_dataplus)._M_p;
      paVar13 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == paVar13) {
        local_f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_f0._M_string_length = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar13;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateTypenameCheck( std::vector<size_t> const &               returnParams,
                                                       std::map<size_t, VectorParamData> const & vectorParams,
                                                       std::vector<size_t> const &               chainedReturnParams,
                                                       bool                                      definition,
                                                       std::vector<std::string> const &          dataTypes,
                                                       CommandFlavourFlags                       flavourFlags ) const
{
  std::string typenameCheck, enableIf;
  if ( !( flavourFlags & CommandFlavourFlagBits::singular ) )
  {
    for ( size_t i = 0; i < returnParams.size(); ++i )
    {
      if ( vectorParams.contains( returnParams[i] ) )
      {
        std::string elementType         = ( ( flavourFlags & CommandFlavourFlagBits::chained ) &&
                                    std::ranges::any_of( chainedReturnParams, [&returnParams, i]( size_t crp ) { return crp == returnParams[i]; } ) )
                                          ? "StructureChain"
                                          : dataTypes[i];
        std::string extendedElementType = elementType;
        if ( flavourFlags & CommandFlavourFlagBits::unique )
        {
          extendedElementType = "UniqueHandle<" + elementType + ", Dispatch>";
        }
        elementType = startUpperCase( stripPrefix( elementType, "VULKAN_HPP_NAMESPACE::" ) );
        if ( !enableIf.empty() )
        {
          enableIf += " && ";
        }
        enableIf += "std::is_same<typename " + elementType + "Allocator::value_type, " + extendedElementType + " > ::value ";
      }
    }
    if ( !enableIf.empty() )
    {
      typenameCheck = ", typename std::enable_if<" + enableIf + ", int>::type" + ( definition ? "" : " = 0" );
    }
  }
  return typenameCheck;
}